

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O1

LispPTR linkblock(LispPTR base)

{
  DLword *pDVar1;
  ulong uVar2;
  DLword *pDVar3;
  DLword *pDVar4;
  uint uVar5;
  LispPTR onfreelist;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar2 = (ulong)base;
  if (*FreeBlockBuckets_word != 0) {
    if ((base & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
    }
    uVar5 = (uint)Lisp_world[uVar2];
    onfreelist = 0;
    uVar8 = (uint)Lisp_world[uVar2];
    if (3 < uVar8) {
      pDVar1 = Lisp_world + uVar2;
      uVar6 = 0;
      do {
        uVar8 = uVar8 >> 1;
        uVar6 = uVar6 + 1;
      } while (uVar8 != 1);
      iVar7 = 0x3c;
      if (uVar6 < 0x1e) {
        iVar7 = 2;
        do {
          uVar5 = uVar5 >> 1;
          iVar7 = iVar7 + 2;
        } while (uVar5 != 1);
      }
      uVar8 = iVar7 + *FreeBlockBuckets_word & 0xfffffff;
      if ((*FreeBlockBuckets_word & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
      }
      pDVar3 = Lisp_world;
      uVar5 = *(uint *)(Lisp_world + uVar8) & 0xfffffff;
      if (uVar5 == 0) {
        *(LispPTR *)(pDVar1 + 2) = base;
      }
      else {
        if ((*(uint *)(Lisp_world + uVar8) & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
        }
        pDVar4 = Lisp_world;
        *(uint *)(pDVar1 + 2) = uVar5;
        *(undefined4 *)(pDVar1 + 4) = *(undefined4 *)(pDVar4 + (ulong)uVar5 + 4);
        uVar6 = *(uint *)(pDVar4 + (ulong)uVar5 + 4);
        if ((uVar6 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
        }
        pDVar1 = pDVar4 + uVar5;
        *(LispPTR *)(Lisp_world + (ulong)uVar6 + 2) = base;
      }
      *(LispPTR *)(pDVar1 + 4) = base;
      *(LispPTR *)(pDVar3 + uVar8) = base;
      onfreelist = 1;
    }
    checkarrayblock(base,1,onfreelist);
  }
  return base;
}

Assistant:

LispPTR linkblock(LispPTR base) {
  struct arrayblock *bbase, *fbbase, *tmpbase;
  LispPTR fbl, freeblocklsp;
  LispPTR *freeblock;
  if (*FreeBlockBuckets_word != NIL) {
    bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
    if (bbase->arlen < MINARRAYBLOCKSIZE)
      checkarrayblock(base, T, NIL);
    else {
      fbl = FreeBlockChainN(bbase->arlen);
      freeblock = (LispPTR *)NativeAligned4FromLAddr(POINTERMASK & fbl);
      freeblocklsp = POINTERMASK & (*freeblock);
      if (freeblocklsp == NIL) {
        bbase->fwd = base;
        bbase->bkwd = base;
      } else {
        fbbase = (struct arrayblock *)NativeAligned4FromLAddr(freeblocklsp);
        bbase->fwd = freeblocklsp;
        bbase->bkwd = fbbase->bkwd;
        tmpbase = (struct arrayblock *)NativeAligned4FromLAddr(fbbase->bkwd);
        tmpbase->fwd = base;
        fbbase->bkwd = base;
      }
      *freeblock = base;
      checkarrayblock(base, T, T);
    }
  }
  return (base);
}